

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void glslang::TIntermediate::updateOffset
               (TType *parentType,TType *memberType,int *offset,int *memberSize)

{
  byte bVar1;
  int *size;
  int *type;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool local_49;
  int memberAlignment;
  TLayoutMatrix subMatrixLayout;
  int dummyStride;
  int *memberSize_local;
  int *offset_local;
  TType *memberType_local;
  TType *parentType_local;
  
  _subMatrixLayout = memberSize;
  memberSize_local = offset;
  offset_local = (int *)memberType;
  memberType_local = parentType;
  iVar2 = (*memberType->_vptr_TType[0xb])();
  type = offset_local;
  size = _subMatrixLayout;
  uVar3 = (uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var,iVar2) + 8) >> 0x3d);
  iVar2 = (*memberType_local->_vptr_TType[0xb])();
  bVar1 = *(byte *)(CONCAT44(extraout_var_00,iVar2) + 0x10);
  if (uVar3 == 0) {
    iVar2 = (*memberType_local->_vptr_TType[0xb])();
    uVar3 = (uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_01,iVar2) + 8) >> 0x3d);
  }
  local_49 = uVar3 == 1;
  iVar2 = getMemberAlignment((TType *)type,size,&memberAlignment,(uint)(bVar1 & 0xf),local_49);
  RoundToPow2<int>(memberSize_local,iVar2);
  return;
}

Assistant:

void TIntermediate::updateOffset(const TType& parentType, const TType& memberType, int& offset, int& memberSize)
{
    int dummyStride;

    // modify just the children's view of matrix layout, if there is one for this member
    TLayoutMatrix subMatrixLayout = memberType.getQualifier().layoutMatrix;
    int memberAlignment = getMemberAlignment(memberType, memberSize, dummyStride,
                                             parentType.getQualifier().layoutPacking,
                                             subMatrixLayout != ElmNone
                                                 ? subMatrixLayout == ElmRowMajor
                                                 : parentType.getQualifier().layoutMatrix == ElmRowMajor);
    RoundToPow2(offset, memberAlignment);
}